

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_conn.cpp
# Opt level: O1

void __thiscall CNetConnection::Disconnect(CNetConnection *this,char *pReason)

{
  ushort uVar1;
  int iVar2;
  int64 iVar3;
  TOKEN Token;
  CNetBase *this_00;
  char *pcVar4;
  
  if (this->m_State != 0) {
    if (this->m_RemoteClosed == 0) {
      if (pReason == (char *)0x0) {
        iVar3 = time_get();
        this->m_LastSendTime = iVar3;
        this_00 = this->m_pNetBase;
        Token = this->m_PeerToken;
        uVar1 = this->m_Ack;
        iVar2 = 0;
        pcVar4 = (char *)0x0;
      }
      else {
        iVar2 = str_length(pReason);
        iVar2 = iVar2 + 1;
        iVar3 = time_get();
        this->m_LastSendTime = iVar3;
        this_00 = this->m_pNetBase;
        Token = this->m_PeerToken;
        uVar1 = this->m_Ack;
        pcVar4 = pReason;
      }
      CNetBase::SendControlMsg
                (this_00,(NETADDR *)&this->m_PeerAddr,Token,(uint)uVar1,4,pcVar4,iVar2);
      pcVar4 = this->m_ErrorString;
      if (pcVar4 != pReason) {
        if (pReason == (char *)0x0) {
          *pcVar4 = '\0';
        }
        else {
          str_copy(pcVar4,pReason,0x100);
        }
      }
    }
    Reset(this);
    return;
  }
  return;
}

Assistant:

void CNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(m_RemoteClosed == 0)
	{
		if(pReason)
			SendControl(NET_CTRLMSG_CLOSE, pReason, str_length(pReason)+1);
		else
			SendControl(NET_CTRLMSG_CLOSE, 0, 0);

		if(pReason != m_ErrorString)
		{
			if(pReason)
				str_copy(m_ErrorString, pReason, sizeof(m_ErrorString));
			else
				m_ErrorString[0] = 0;
		}
	}

	Reset();
}